

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

void CNetBan::ConBans(IResult *pResult,void *pUser)

{
  long lVar1;
  CBan<NETADDR> *pBan;
  CBan<CNetRange> *pBan_00;
  char *pcVar2;
  uint uVar3;
  CBan<NETADDR> **ppCVar4;
  CBan<CNetRange> **ppCVar5;
  long in_FS_OFFSET;
  char aMsg [256];
  char aBuf [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar4 = (CBan<NETADDR> **)((long)pUser + 0x22820);
  uVar3 = 0;
  while (pBan = *ppCVar4, pBan != (CBan<NETADDR> *)0x0) {
    MakeBanInfo<NETADDR>((CNetBan *)pUser,pBan,aBuf,0x100,1,(int *)0x0);
    str_format(aMsg,0x100,"#%i %s",(ulong)uVar3,aBuf);
    (**(code **)(**(long **)((long)pUser + 8) + 200))
              (*(long **)((long)pUser + 8),0,"net_ban",aMsg,0);
    uVar3 = uVar3 + 1;
    ppCVar4 = &pBan->m_pNext;
  }
  ppCVar5 = (CBan<CNetRange> **)((long)pUser + 0x52838);
  while (pBan_00 = *ppCVar5, pBan_00 != (CBan<CNetRange> *)0x0) {
    MakeBanInfo<CNetRange>((CNetBan *)pUser,pBan_00,aBuf,0x100,1,(int *)0x0);
    str_format(aMsg,0x100,"#%i %s",(ulong)uVar3,aBuf);
    (**(code **)(**(long **)((long)pUser + 8) + 200))
              (*(long **)((long)pUser + 8),0,"net_ban",aMsg,0);
    uVar3 = uVar3 + 1;
    ppCVar5 = &pBan_00->m_pNext;
  }
  pcVar2 = "bans";
  if (uVar3 == 1) {
    pcVar2 = "ban";
  }
  str_format(aMsg,0x100,"%d %s",(ulong)uVar3,pcVar2);
  (**(code **)(**(long **)((long)pUser + 8) + 200))(*(long **)((long)pUser + 8),0,"net_ban",aMsg,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBan::ConBans(IConsole::IResult *pResult, void *pUser)
{
	CNetBan *pThis = static_cast<CNetBan *>(pUser);

	int Count = 0;
	char aBuf[256], aMsg[256];
	for(CBanAddr *pBan = pThis->m_BanAddrPool.First(); pBan; pBan = pBan->m_pNext)
	{
		pThis->MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_LIST);
		str_format(aMsg, sizeof(aMsg), "#%i %s", Count++, aBuf);
		pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
	}
	for(CBanRange *pBan = pThis->m_BanRangePool.First(); pBan; pBan = pBan->m_pNext)
	{
		pThis->MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_LIST);
		str_format(aMsg, sizeof(aMsg), "#%i %s", Count++, aBuf);
		pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
	}
	str_format(aMsg, sizeof(aMsg), "%d %s", Count, Count==1?"ban":"bans");
	pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
}